

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_key_encode_decode.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_a3d2::ARTKeyEncodeDecodeTest_UInt16C00010_Test::
ARTKeyEncodeDecodeTest_UInt16C00010_Test(ARTKeyEncodeDecodeTest_UInt16C00010_Test *this)

{
  ARTKeyEncodeDecodeTest_UInt16C00010_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__ARTKeyEncodeDecodeTest_UInt16C00010_Test_001c7960;
  return;
}

Assistant:

UNODB_TEST(ARTKeyEncodeDecodeTest, UInt16C00010) {
  using T = std::uint16_t;
  constexpr auto one = static_cast<T>(1);
  // Check the encoder byte order.
  constexpr std::array<const std::byte, sizeof(T)> ikey{
      static_cast<std::byte>(0x01), static_cast<std::byte>(0x02)};
  do_encode_decode_test(static_cast<T>(0x0102ULL), ikey);
  // round-trip tests.
  do_encode_decode_test(static_cast<T>(0));
  do_encode_decode_test(static_cast<T>(0 + 1));
  do_encode_decode_test(static_cast<T>(0 - 1));
  do_encode_decode_test(std::numeric_limits<T>::min());
  do_encode_decode_test(std::numeric_limits<T>::max());
  do_encode_decode_test(std::numeric_limits<T>::min() + one);
  do_encode_decode_test(std::numeric_limits<T>::max() - one);
  // check lexicographic ordering for std::uint16_t pairs.
  do_encode_decode_lt_test(static_cast<T>(0x0102ULL),
                           static_cast<T>(0x090AULL));
  do_encode_decode_lt_test(static_cast<T>(0), static_cast<T>(1));
  do_encode_decode_lt_test(static_cast<T>(0x7FFFULL),
                           static_cast<T>(0x8000ULL));
  do_encode_decode_lt_test(static_cast<T>(0xFFFEULL), static_cast<T>(~0ULL));
}